

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_1::WatWriter::WriteExprList(WatWriter *this,ExprList *exprs)

{
  ExprVisitorDelegate delegate;
  ExprVisitor visitor;
  Delegate local_70;
  WatWriter *local_68;
  ExprVisitor local_60;
  
  local_70._vptr_Delegate = (_func_int **)&PTR__Delegate_001f6cb0;
  local_68 = this;
  ExprVisitor::ExprVisitor(&local_60,&local_70);
  ExprVisitor::VisitExprList(&local_60,exprs);
  ExprVisitor::~ExprVisitor(&local_60);
  return;
}

Assistant:

void WatWriter::WriteExprList(const ExprList& exprs) {
  WABT_TRACE(WriteExprList);
  ExprVisitorDelegate delegate(this);
  ExprVisitor visitor(&delegate);
  visitor.VisitExprList(const_cast<ExprList&>(exprs));
}